

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzCompress(bz_stream *strm,int action)

{
  EState *s_00;
  Bool BVar1;
  int in_ESI;
  bz_stream *in_RDI;
  EState *s;
  Bool progress;
  int local_4;
  
  if (in_RDI == (bz_stream *)0x0) {
    local_4 = -2;
  }
  else {
    s_00 = (EState *)in_RDI->state;
    if (s_00 == (EState *)0x0) {
      local_4 = -2;
    }
    else if (s_00->strm == in_RDI) {
LAB_00115ef3:
      switch(s_00->mode) {
      case 1:
        local_4 = -1;
        break;
      case 2:
        if (in_ESI == 0) {
          BVar1 = handle_compress(in_RDI);
          if (BVar1 == '\0') {
            return -2;
          }
          return 1;
        }
        if (in_ESI == 1) {
          s_00->avail_in_expect = in_RDI->avail_in;
          s_00->mode = 3;
        }
        else {
          if (in_ESI != 2) {
            return -2;
          }
          s_00->avail_in_expect = in_RDI->avail_in;
          s_00->mode = 4;
        }
        goto LAB_00115ef3;
      case 3:
        if (in_ESI != 1) {
          return -1;
        }
        if (s_00->avail_in_expect == s_00->strm->avail_in) {
          handle_compress(in_RDI);
          if (((s_00->avail_in_expect == 0) && (BVar1 = isempty_RL(s_00), BVar1 != '\0')) &&
             (s_00->numZ <= s_00->state_out_pos)) {
            s_00->mode = 2;
            return 1;
          }
          return 2;
        }
        return -1;
      case 4:
        if (in_ESI != 2) {
          return -1;
        }
        if (s_00->avail_in_expect != s_00->strm->avail_in) {
          return -1;
        }
        BVar1 = handle_compress(in_RDI);
        if (BVar1 == '\0') {
          return -1;
        }
        if (((s_00->avail_in_expect == 0) && (BVar1 = isempty_RL(s_00), BVar1 != '\0')) &&
           (s_00->numZ <= s_00->state_out_pos)) {
          s_00->mode = 1;
          return 4;
        }
        return 3;
      default:
        local_4 = 0;
      }
    }
    else {
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzCompress) ( bz_stream *strm, int action )
{
   Bool progress;
   EState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   preswitch:
   switch (s->mode) {

      case BZ_M_IDLE:
         return BZ_SEQUENCE_ERROR;

      case BZ_M_RUNNING:
         if (action == BZ_RUN) {
            progress = handle_compress ( strm );
            return progress ? BZ_RUN_OK : BZ_PARAM_ERROR;
         }
         else
         if (action == BZ_FLUSH) {
            s->avail_in_expect = strm->avail_in;
            s->mode = BZ_M_FLUSHING;
            goto preswitch;
         }
         else
         if (action == BZ_FINISH) {
            s->avail_in_expect = strm->avail_in;
            s->mode = BZ_M_FINISHING;
            goto preswitch;
         }
         else
            return BZ_PARAM_ERROR;

      case BZ_M_FLUSHING:
         if (action != BZ_FLUSH) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect != s->strm->avail_in)
            return BZ_SEQUENCE_ERROR;
         progress = handle_compress ( strm );
         if (s->avail_in_expect > 0 || !isempty_RL(s) ||
             s->state_out_pos < s->numZ) return BZ_FLUSH_OK;
         s->mode = BZ_M_RUNNING;
         return BZ_RUN_OK;

      case BZ_M_FINISHING:
         if (action != BZ_FINISH) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect != s->strm->avail_in)
            return BZ_SEQUENCE_ERROR;
         progress = handle_compress ( strm );
         if (!progress) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect > 0 || !isempty_RL(s) ||
             s->state_out_pos < s->numZ) return BZ_FINISH_OK;
         s->mode = BZ_M_IDLE;
         return BZ_STREAM_END;
   }
   return BZ_OK; /*--not reached--*/
}